

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  byte bVar1;
  uchar uVar2;
  uchar *puVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  byte *pbVar7;
  int iVar8;
  uchar *puVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  puVar3 = data;
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                    ,0x543,
                    "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                   );
    }
    puVar3 = (uchar *)malloc((ulong)(x * req_comp * y));
    if (puVar3 == (uchar *)0x0) {
      free(data);
      stbi__g_failure_reason = "outofmem";
      puVar3 = (uchar *)0x0;
    }
    else {
      if (0 < (int)y) {
        uVar12 = req_comp + img_n * 8;
        if ((0x23 < uVar12) || ((0xe161a1c00U >> ((ulong)uVar12 & 0x3f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                        ,0x560,
                        "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                       );
        }
        iVar4 = x - 1;
        uVar10 = 0;
        uVar6 = 0;
        uVar11 = 0;
        do {
          iVar8 = (int)uVar11 * x;
          if (uVar12 - 10 < 0x19) {
            pbVar7 = data + (uint)(iVar8 * img_n);
            switch(uVar12) {
            case 10:
              if (-1 < iVar4) {
                lVar5 = 0;
                do {
                  puVar3[lVar5 * 2 + uVar6] = data[lVar5 + (ulong)uVar10];
                  puVar3[lVar5 * 2 + uVar6 + 1] = 0xff;
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0xb:
              if (-1 < iVar4) {
                puVar9 = puVar3 + uVar6 + 2;
                lVar5 = 0;
                do {
                  uVar2 = data[lVar5 + (ulong)uVar10];
                  *puVar9 = uVar2;
                  puVar9[-1] = uVar2;
                  puVar9[-2] = uVar2;
                  lVar5 = lVar5 + 1;
                  puVar9 = puVar9 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0xc:
              if (-1 < iVar4) {
                lVar5 = 0;
                do {
                  uVar2 = data[lVar5 + (ulong)uVar10];
                  puVar3[lVar5 * 4 + uVar6 + 2] = uVar2;
                  puVar3[lVar5 * 4 + uVar6 + 1] = uVar2;
                  puVar3[lVar5 * 4 + uVar6] = uVar2;
                  puVar3[lVar5 * 4 + uVar6 + 3] = 0xff;
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            default:
              goto switchD_0011e415_caseD_d;
            case 0x11:
              if (-1 < iVar4) {
                lVar5 = 0;
                do {
                  puVar3[lVar5 + uVar6] = data[lVar5 * 2 + (ulong)uVar10];
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x13:
              if (-1 < iVar4) {
                puVar9 = puVar3 + uVar6 + 2;
                lVar5 = 0;
                do {
                  uVar2 = data[lVar5 * 2 + (ulong)uVar10];
                  *puVar9 = uVar2;
                  puVar9[-1] = uVar2;
                  puVar9[-2] = uVar2;
                  lVar5 = lVar5 + 1;
                  puVar9 = puVar9 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x14:
              if (-1 < iVar4) {
                lVar5 = 0;
                do {
                  uVar2 = data[lVar5 * 2 + (ulong)uVar10];
                  puVar3[lVar5 * 4 + uVar6 + 2] = uVar2;
                  puVar3[lVar5 * 4 + uVar6 + 1] = uVar2;
                  puVar3[lVar5 * 4 + uVar6] = uVar2;
                  puVar3[lVar5 * 4 + uVar6 + 3] = data[lVar5 * 2 + (ulong)uVar10 + 1];
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x19:
              if (-1 < iVar4) {
                lVar5 = 0;
                do {
                  bVar1 = pbVar7[2];
                  puVar3[lVar5 + uVar6] =
                       (uchar)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                               (uint)pbVar7[1] * 0x96 + (uint)*pbVar7 * 0x4d >> 8);
                  lVar5 = lVar5 + 1;
                  pbVar7 = pbVar7 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x1a:
              if (-1 < iVar4) {
                lVar5 = 0;
                do {
                  bVar1 = pbVar7[2];
                  puVar3[lVar5 * 2 + uVar6] =
                       (uchar)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                               (uint)pbVar7[1] * 0x96 + (uint)*pbVar7 * 0x4d >> 8);
                  puVar3[lVar5 * 2 + uVar6 + 1] = 0xff;
                  lVar5 = lVar5 + 1;
                  pbVar7 = pbVar7 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x1c:
              if (-1 < iVar4) {
                lVar5 = 0;
                do {
                  puVar3[lVar5 * 4 + uVar6] = *pbVar7;
                  puVar3[lVar5 * 4 + uVar6 + 1] = pbVar7[1];
                  puVar3[lVar5 * 4 + uVar6 + 2] = pbVar7[2];
                  puVar3[lVar5 * 4 + uVar6 + 3] = 0xff;
                  lVar5 = lVar5 + 1;
                  pbVar7 = pbVar7 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x21:
              if (-1 < iVar4) {
                lVar5 = 0;
                do {
                  bVar1 = data[lVar5 * 4 + (ulong)uVar10 + 2];
                  puVar3[lVar5 + uVar6] =
                       (uchar)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                               (uint)data[lVar5 * 4 + (ulong)uVar10 + 1] * 0x96 +
                               (uint)data[lVar5 * 4 + (ulong)uVar10] * 0x4d >> 8);
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x22:
              if (-1 < iVar4) {
                lVar5 = 0;
                do {
                  bVar1 = data[lVar5 * 4 + (ulong)uVar10 + 2];
                  puVar3[lVar5 * 2 + uVar6] =
                       (uchar)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                               (uint)data[lVar5 * 4 + (ulong)uVar10 + 1] * 0x96 +
                               (uint)data[lVar5 * 4 + (ulong)uVar10] * 0x4d >> 8);
                  puVar3[lVar5 * 2 + uVar6 + 1] = data[lVar5 * 4 + (ulong)uVar10 + 3];
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
            }
          }
          else {
switchD_0011e415_caseD_d:
            if (-1 < iVar4) {
              puVar9 = puVar3 + (uint)(iVar8 * req_comp);
              lVar5 = 0;
              do {
                *puVar9 = data[lVar5 * 4 + (ulong)uVar10];
                puVar9[1] = data[lVar5 * 4 + (ulong)uVar10 + 1];
                puVar9[2] = data[lVar5 * 4 + (ulong)uVar10 + 2];
                lVar5 = lVar5 + 1;
                puVar9 = puVar9 + 3;
              } while (x != (uint)lVar5);
            }
          }
          uVar11 = uVar11 + 1;
          uVar6 = (ulong)((int)uVar6 + x * req_comp);
          uVar10 = uVar10 + x * img_n;
        } while (uVar11 != y);
      }
      free(data);
    }
  }
  return puVar3;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc(req_comp * x * y);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define COMBO(a,b)  ((a)*8+(b))
      #define CASE(a,b)   case COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (COMBO(img_n, req_comp)) {
         CASE(1,2) dest[0]=src[0], dest[1]=255; break;
         CASE(1,3) dest[0]=dest[1]=dest[2]=src[0]; break;
         CASE(1,4) dest[0]=dest[1]=dest[2]=src[0], dest[3]=255; break;
         CASE(2,1) dest[0]=src[0]; break;
         CASE(2,3) dest[0]=dest[1]=dest[2]=src[0]; break;
         CASE(2,4) dest[0]=dest[1]=dest[2]=src[0], dest[3]=src[1]; break;
         CASE(3,4) dest[0]=src[0],dest[1]=src[1],dest[2]=src[2],dest[3]=255; break;
         CASE(3,1) dest[0]=stbi__compute_y(src[0],src[1],src[2]); break;
         CASE(3,2) dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = 255; break;
         CASE(4,1) dest[0]=stbi__compute_y(src[0],src[1],src[2]); break;
         CASE(4,2) dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = src[3]; break;
         CASE(4,3) dest[0]=src[0],dest[1]=src[1],dest[2]=src[2]; break;
         default: STBI_ASSERT(0);
      }
      #undef CASE
   }

   STBI_FREE(data);
   return good;
}